

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv4Transmitter::GetLocalHostName
          (RTPUDPv4Transmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  uint uVar1;
  _List_node_base *p_Var2;
  RTPMemoryManager *pRVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  hostent *phVar8;
  _Node *p_Var9;
  long lVar10;
  size_t sVar11;
  uint8_t *puVar12;
  ulong uVar13;
  undefined1 *puVar14;
  _Alloc_hider _Var15;
  _List_node_base *p_Var16;
  bool bVar17;
  uint8_t addr [4];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  string hname;
  string hname_1;
  allocator<char> local_c9;
  ulong *local_c8;
  _List_node_base *local_c0;
  uint local_b4;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  hostent *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RTPUDPv4Transmitter *local_48;
  uint8_t *local_40;
  _List_node_base *local_38;
  
  iVar6 = -0x5a;
  if ((this->init == true) && (iVar6 = -0x59, this->created == true)) {
    local_40 = buffer;
    if (this->localhostname == (uint8_t *)0x0) {
      local_38 = (_List_node_base *)&this->localIPs;
      local_c0 = (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
      if (local_c0 == local_38) {
        return -0x55;
      }
      local_b0._M_impl._M_node._M_size = 0;
      local_c8 = bufferlength;
      local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
      local_b0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b0;
      local_48 = this;
      do {
        bVar17 = false;
LAB_0012078c:
        uVar1 = *(uint *)&local_c0[1]._M_next;
        local_b4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        phVar8 = gethostbyaddr(&local_b4,4,2);
        if (phVar8 != (hostent *)0x0) {
          local_70 = phVar8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,phVar8->h_name,(allocator<char> *)&local_68);
          sVar4 = local_98._M_string_length;
          _Var15._M_p = local_98._M_dataplus._M_p;
          p_Var16 = (_List_node_base *)&local_b0;
          while (!bVar17) {
            p_Var16 = p_Var16->_M_next;
            if (p_Var16 == (_List_node_base *)&local_b0) {
              p_Var9 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                       ::_M_create_node<std::__cxx11::string_const&>
                                 ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                  )&local_b0,&local_98);
              std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
              local_b0._M_impl._M_node._M_size = local_b0._M_impl._M_node._M_size + 1;
              break;
            }
            if ((p_Var16[1]._M_prev == (_List_node_base *)sVar4) &&
               ((bVar5 = true, (_List_node_base *)sVar4 == (_List_node_base *)0x0 ||
                (iVar6 = bcmp(p_Var16[1]._M_next,_Var15._M_p,sVar4), iVar6 == 0))))
            goto LAB_00120837;
          }
          bVar5 = bVar17;
          if (!bVar17) {
            iVar6 = 0;
            goto LAB_00120876;
          }
          goto LAB_00120837;
        }
LAB_0012094b:
        this = local_48;
        local_c0 = local_c0->_M_next;
      } while (local_c0 != local_38);
      if (local_b0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_b0) {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::sort((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_b0);
        for (p_Var16 = local_b0._M_impl._M_node.super__List_node_base._M_next;
            p_Var16 != (_List_node_base *)&local_b0; p_Var16 = p_Var16->_M_next) {
          lVar10 = std::__cxx11::string::find((char)(p_Var16 + 1),0x2e);
          if (lVar10 != -1) {
            p_Var2 = p_Var16[1]._M_prev;
            this->localhostnamelength = (size_t)p_Var2;
            puVar14 = (undefined1 *)((long)&p_Var2->_M_next + 1);
            pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
            if (pRVar3 == (RTPMemoryManager *)0x0) {
              puVar12 = (uint8_t *)operator_new__((ulong)puVar14);
              this->localhostname = puVar12;
            }
            else {
              puVar12 = (uint8_t *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,puVar14,0);
              this->localhostname = puVar12;
              if (puVar12 == (uint8_t *)0x0) goto LAB_00120a2b;
            }
            memcpy(puVar12,p_Var16[1]._M_next,this->localhostnamelength);
            this->localhostname[this->localhostnamelength] = '\0';
            bufferlength = local_c8;
            goto LAB_00120a75;
          }
        }
      }
      uVar1 = *(uint *)&(this->localIPs).
                        super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        _M_node.super__List_node_base._M_next[1]._M_next;
      snprintf((char *)&local_98,0x10,"%d.%d.%d.%d",(ulong)(uVar1 >> 0x18),
               (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
      sVar11 = strlen((char *)&local_98);
      this->localhostnamelength = (long)(int)sVar11;
      uVar13 = (long)(int)sVar11 + 1;
      pRVar3 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar3 == (RTPMemoryManager *)0x0) {
        puVar12 = (uint8_t *)operator_new__(uVar13);
        this->localhostname = puVar12;
      }
      else {
        puVar12 = (uint8_t *)(**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,uVar13,0);
        this->localhostname = puVar12;
        if (puVar12 == (uint8_t *)0x0) {
LAB_00120a2b:
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&local_b0);
          return -1;
        }
      }
      bufferlength = local_c8;
      memcpy(puVar12,&local_98,this->localhostnamelength);
      this->localhostname[this->localhostnamelength] = '\0';
LAB_00120a75:
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&local_b0);
    }
    uVar13 = this->localhostnamelength;
    if (*bufferlength < uVar13) {
      *bufferlength = uVar13;
      iVar6 = -0x45;
    }
    else {
      memcpy(local_40,this->localhostname,uVar13);
      *bufferlength = this->localhostnamelength;
      iVar6 = 0;
    }
  }
  return iVar6;
LAB_00120876:
  do {
    bVar5 = bVar17;
    if (local_70->h_aliases[iVar6] == (char *)0x0) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,local_70->h_aliases[iVar6],&local_c9);
    sVar4 = local_68._M_string_length;
    _Var15._M_p = local_68._M_dataplus._M_p;
    p_Var16 = local_b0._M_impl._M_node.super__List_node_base._M_next;
    if (!bVar17) {
      for (; p_Var16 != (_List_node_base *)&local_b0; p_Var16 = p_Var16->_M_next) {
        if (p_Var16[1]._M_prev == (_List_node_base *)sVar4) {
          if ((_List_node_base *)sVar4 == (_List_node_base *)0x0) {
            bVar17 = true;
            goto LAB_0012090a;
          }
          iVar7 = bcmp(p_Var16[1]._M_next,_Var15._M_p,sVar4);
          if (iVar7 == 0) {
            bVar17 = true;
            goto LAB_0012090a;
          }
        }
      }
      p_Var9 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &local_b0,&local_68);
      std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
      local_b0._M_impl._M_node._M_size = local_b0._M_impl._M_node._M_size + 1;
      iVar6 = iVar6 + 1;
      _Var15._M_p = local_68._M_dataplus._M_p;
    }
LAB_0012090a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var15._M_p != &local_68.field_2) {
      operator_delete(_Var15._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar5 = bVar17;
  } while (!bVar17);
LAB_00120837:
  bVar17 = bVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((local_70 == (hostent *)0x0) || (bVar17)) goto LAB_0012094b;
  goto LAB_0012078c;
}

Assistant:

int RTPUDPv4Transmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_NOLOCALIPS;
		}
		
		std::list<uint32_t>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			bool founddouble = false;
			bool foundentry = true;

			while (!founddouble && foundentry)
			{
				struct hostent *he;
				uint8_t addr[4];
				uint32_t ip = (*it);
		
				addr[0] = (uint8_t)((ip>>24)&0xFF);
				addr[1] = (uint8_t)((ip>>16)&0xFF);
				addr[2] = (uint8_t)((ip>>8)&0xFF);
				addr[3] = (uint8_t)(ip&0xFF);
				he = gethostbyaddr((char *)addr,4,AF_INET);
				if (he != 0)
				{
					std::string hname = std::string(he->h_name);
					std::list<std::string>::const_iterator it;

					for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
						if ((*it) == hname)
							founddouble = true;

					if (!founddouble)
						hostnames.push_back(hname);
					
					int i = 0;
					while (!founddouble && he->h_aliases[i] != 0)
					{
						std::string hname = std::string(he->h_aliases[i]);
					
						for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
							if ((*it) == hname)
								founddouble = true;

						if (!founddouble)
						{
							hostnames.push_back(hname);
							i++;
						}
					}
				}
				else
					foundentry = false;
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
		
			hostnames.sort();
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			uint32_t ip;
			int len;
			char str[16];
			
			it = localIPs.begin();
			ip = (*it);
			
			RTP_SNPRINTF(str,16,"%d.%d.%d.%d",(int)((ip>>24)&0xFF),(int)((ip>>16)&0xFF),(int)((ip>>8)&0xFF),(int)(ip&0xFF));
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength + 1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}